

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec * cram_beta_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  kh_m_i2i_t *pkVar1;
  cram_codec *pcVar2;
  cram_external_type cVar3;
  khint32_t kVar4;
  long lVar5;
  int iVar6;
  code *pcVar8;
  khint32_t kVar9;
  khint32_t kVar10;
  byte bVar11;
  ulong uVar12;
  khint32_t kVar7;
  
  pcVar2 = (cram_codec *)malloc(0x240);
  if (pcVar2 != (cram_codec *)0x0) {
    pcVar2->codec = E_BETA;
    pcVar2->free = cram_beta_encode_free;
    pcVar8 = cram_beta_encode_char;
    if (option == E_INT) {
      pcVar8 = cram_beta_encode_int;
    }
    pcVar2->encode = pcVar8;
    pcVar2->store = cram_beta_encode_store;
    if (dat == (void *)0x0) {
      kVar7 = 0x80000000;
      kVar9 = 0x7fffffff;
      for (lVar5 = 0; lVar5 != 0x400; lVar5 = lVar5 + 1) {
        kVar4 = (khint32_t)lVar5;
        kVar10 = kVar4;
        if ((int)kVar9 < (int)kVar4) {
          kVar10 = kVar9;
        }
        if (st->freqs[lVar5] != 0) {
          kVar7 = kVar4;
          kVar9 = kVar10;
        }
      }
      pkVar1 = st->h;
      if (pkVar1 != (kh_m_i2i_t *)0x0) {
        bVar11 = 0;
        for (uVar12 = 0; pkVar1->n_buckets != uVar12; uVar12 = uVar12 + 1) {
          if ((pkVar1->flags[uVar12 >> 4 & 0xfffffff] >> (bVar11 & 0x1e) & 3) == 0) {
            kVar10 = pkVar1->keys[uVar12];
            if ((int)kVar10 <= (int)kVar9) {
              kVar9 = kVar10;
            }
            if ((int)kVar7 <= (int)kVar10) {
              kVar7 = kVar10;
            }
          }
          bVar11 = bVar11 + 2;
        }
      }
    }
    else {
      kVar9 = *dat;
      kVar7 = *(khint32_t *)((long)dat + 4);
    }
    iVar6 = kVar7 - kVar9;
    if ((int)kVar7 < (int)kVar9) {
      __assert_fail("max_val >= min_val",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                    ,0x2a7,
                    "cram_codec *cram_beta_encode_init(cram_stats *, enum cram_external_type, void *, int)"
                   );
    }
    (pcVar2->field_6).huffman.ncodes = -kVar9;
    cVar3 = 0;
    for (; iVar6 != 0; iVar6 = iVar6 >> 1) {
      cVar3 = cVar3 + E_INT;
    }
    (pcVar2->field_6).external.type = cVar3;
  }
  return pcVar2;
}

Assistant:

cram_codec *cram_beta_encode_init(cram_stats *st,
				  enum cram_external_type option,
				  void *dat,
				  int version) {
    cram_codec *c;
    int min_val, max_val, len = 0;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec  = E_BETA;
    c->free   = cram_beta_encode_free;
    if (option == E_INT)
	c->encode = cram_beta_encode_int;
    else
	c->encode = cram_beta_encode_char;
    c->store  = cram_beta_encode_store;

    if (dat) {
	min_val = ((int *)dat)[0];
	max_val = ((int *)dat)[1];
    } else {
	min_val = INT_MAX;
	max_val = INT_MIN;
	int i;
	for (i = 0; i < MAX_STAT_VAL; i++) {
	    if (!st->freqs[i])
		continue;
	    if (min_val > i)
		min_val = i;
	    max_val = i;
	}
	if (st->h) {
	    khint_t k;

	    for (k = kh_begin(st->h); k != kh_end(st->h); k++) {
		if (!kh_exist(st->h, k))
		    continue;
	    
		i = kh_key(st->h, k);
		if (min_val > i)
		    min_val = i;
		if (max_val < i)
		    max_val = i;
	    }
	}
    }

    assert(max_val >= min_val);
    c->e_beta.offset = -min_val;
    max_val -= min_val;
    while (max_val) {
	len++;
	max_val >>= 1;
    }
    c->e_beta.nbits = len;

    return c;
}